

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

StatisticObject __thiscall Clasp::ClaspFacade::SolveData::BoundArray::at(BoundArray *this,uint32 i)

{
  long lVar1;
  LevelRef *obj;
  uint32 type;
  ulong uVar2;
  uint uVar3;
  StatisticObject local_30;
  
  uVar2 = (this->data->en).ptr_ & 0xfffffffffffffffe;
  if (((uVar2 != 0) && (lVar1 = *(long *)(uVar2 + 8), lVar1 != 0)) && (i < *(uint *)(lVar1 + 8))) {
    uVar3 = (this->refs).ebo_.size;
    if (uVar3 <= i) {
      do {
        local_30.handle_ = (uint64)operator_new(0x10);
        *(BoundArray **)local_30.handle_ = this;
        *(uint *)(local_30.handle_ + 8) = uVar3;
        bk_lib::
        pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
        ::push_back(&this->refs,(LevelRef **)&local_30);
        uVar3 = (this->refs).ebo_.size;
      } while (uVar3 <= i);
    }
    obj = (this->refs).ebo_.buf[i];
    type = StatisticObject::
           registerValue<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef,_&Clasp::ClaspFacade::SolveData::BoundArray::LevelRef::value>
                     ();
    StatisticObject::StatisticObject(&local_30,obj,type);
    return (StatisticObject)local_30.handle_;
  }
  Potassco::fail(-2,"StatisticObject Clasp::ClaspFacade::SolveData::BoundArray::at(uint32) const",
                 0x1c1,"i < size()","invalid key",0);
}

Assistant:

StatisticObject at(uint32 i) const {
			POTASSCO_REQUIRE(i < size(), "invalid key");
			while (i >= refs.size()) { refs.push_back(new LevelRef(this, sizeVec(refs))); }
			return StatisticObject::value<LevelRef, &LevelRef::value>(refs[i]);
		}